

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
pstore::dump::string::write_unquoted<std::ostream>
          (basic_ostream<char,_std::char_traits<char>_> *os,string *v)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  undefined8 in_RAX;
  size_type sVar4;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if ((v->_M_string_length != 0) && ((byte)(*(v->_M_dataplus)._M_p - 0x21U) < 2)) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"\\",1);
  }
  sVar2 = v->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (v->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      cVar1 = pcVar3[sVar4];
      if (cVar1 == '\\') {
        uStack_38._0_7_ = CONCAT16(0x5c,(undefined6)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 6),1);
      }
      uStack_38 = CONCAT17(cVar1,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 7),1);
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  return os;
}

Assistant:

OStream & string::write_unquoted (OStream & os, std::string const & v) {
            // If the string starts with backslash or bang, prefix with a backslash
            if (v.length () > 0) {
                auto const front = v.front ();
                if (front == '\"' || front == '!') {
                    os << "\\";
                }
            }
            // Emit the characters; a backslash is escaped.
            for (char ch : v) {
                if (ch == '\\') {
                    os << '\\';
                }
                os << ch;
            }
            return os;
        }